

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_account.c
# Opt level: O0

IOTHUB_ACCOUNT_INFO_HANDLE
IoTHubAccount_Init_With_Config(IOTHUB_ACCOUNT_CONFIG *config,_Bool testingModules)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_PROVISIONED_DEVICE **ppIVar3;
  char *pcVar4;
  IOTHUB_SERVICE_CLIENT_AUTH_HANDLE pIVar5;
  IOTHUB_MESSAGING_HANDLE pIVar6;
  IOTHUB_REGISTRYMANAGER_HANDLE pIVar7;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  char *tempThumb;
  char *base64_key;
  char *base64_cert;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_ACCOUNT_INFO *iothub_account_info;
  _Bool testingModules_local;
  IOTHUB_ACCOUNT_CONFIG *config_local;
  
  if (config == (IOTHUB_ACCOUNT_CONFIG *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                ,"IoTHubAccount_Init_With_Config",0x28a,1,
                "[IoTHubAccount] invalid configuration (NULL)");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)malloc(0xc0);
    if ((IOTHUB_ACCOUNT_INFO *)l == (IOTHUB_ACCOUNT_INFO *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                  ,"IoTHubAccount_Init_With_Config",0x293,1,
                  "[IoTHubAccount] Failed allocating IOTHUB_ACCOUNT_INFO.");
      }
    }
    else {
      memset(l,0,0xc0);
      ppIVar3 = (IOTHUB_PROVISIONED_DEVICE **)malloc(config->number_of_sas_devices << 3);
      ((IOTHUB_ACCOUNT_INFO *)l)->sasDevices = ppIVar3;
      if (ppIVar3 == (IOTHUB_PROVISIONED_DEVICE **)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                    ,"IoTHubAccount_Init_With_Config",0x29e,1,
                    "[IoTHubAccount] Failed allocating array for SAS devices");
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        ((IOTHUB_ACCOUNT_INFO *)l)->number_of_sas_devices = config->number_of_sas_devices;
        memset(((IOTHUB_ACCOUNT_INFO *)l)->sasDevices,0,
               ((IOTHUB_ACCOUNT_INFO *)l)->number_of_sas_devices << 3);
        pcVar4 = getenv("IOTHUB_CONNECTION_STRING");
        ((IOTHUB_ACCOUNT_INFO *)l)->connString = pcVar4;
        pcVar4 = getenv("IOTHUB_EVENTHUB_CONNECTION_STRING");
        ((IOTHUB_ACCOUNT_INFO *)l)->eventhubConnString = pcVar4;
        getenv("IOTHUB_E2E_X509_CERT_BASE64");
        getenv("IOTHUB_E2E_X509_PRIVATE_KEY_BASE64");
        getenv("IOTHUB_E2E_X509_THUMBPRINT");
        if (((IOTHUB_ACCOUNT_INFO *)l)->connString == (char *)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                      ,"IoTHubAccount_Init_With_Config",0x2b7,1,
                      "Failure retrieving IoT Hub connection string from the environment.\r\n");
          }
          free(l);
          l = (LOGGER_LOG)0x0;
        }
        else if (((IOTHUB_ACCOUNT_INFO *)l)->eventhubConnString == (char *)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                      ,"IoTHubAccount_Init_With_Config",0x2bd,1,
                      "Failure retrieving Event Hub connection string from the environment.\r\n");
          }
          free(l);
          l = (LOGGER_LOG)0x0;
        }
        else {
          iVar1 = retrieveConnStringInfo((IOTHUB_ACCOUNT_INFO *)l);
          if (iVar1 == 0) {
            pIVar5 = IoTHubServiceClientAuth_CreateFromConnectionString
                               (((IOTHUB_ACCOUNT_INFO *)l)->connString);
            ((IOTHUB_ACCOUNT_INFO *)l)->iothub_service_client_auth_handle = pIVar5;
            if (((IOTHUB_ACCOUNT_INFO *)l)->iothub_service_client_auth_handle ==
                (IOTHUB_SERVICE_CLIENT_AUTH_HANDLE)0x0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                          ,"IoTHubAccount_Init_With_Config",0x2f5,1,
                          "IoTHubServiceClientAuth_CreateFromConnectionString failed\r\n");
              }
              free(l);
              l = (LOGGER_LOG)0x0;
            }
            else {
              pIVar6 = IoTHubMessaging_LL_Create
                                 (((IOTHUB_ACCOUNT_INFO *)l)->iothub_service_client_auth_handle);
              ((IOTHUB_ACCOUNT_INFO *)l)->iothub_messaging_handle = pIVar6;
              if (((IOTHUB_ACCOUNT_INFO *)l)->iothub_messaging_handle ==
                  (IOTHUB_MESSAGING_HANDLE)0x0) {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                            ,"IoTHubAccount_Init_With_Config",0x2fe,1,
                            "IoTHubMessaging_LL_Create failed\r\n");
                }
                IoTHubAccount_deinit((IOTHUB_ACCOUNT_INFO_HANDLE)l);
                l = (LOGGER_LOG)0x0;
              }
              else {
                pIVar7 = IoTHubRegistryManager_Create
                                   (((IOTHUB_ACCOUNT_INFO *)l)->iothub_service_client_auth_handle);
                ((IOTHUB_ACCOUNT_INFO *)l)->iothub_registrymanager_handle = pIVar7;
                if (((IOTHUB_ACCOUNT_INFO *)l)->iothub_registrymanager_handle ==
                    (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                              ,"IoTHubAccount_Init_With_Config",0x307,1,
                              "IoTHubRegistryManager_Create failed\r\n");
                  }
                  IoTHubAccount_deinit((IOTHUB_ACCOUNT_INFO_HANDLE)l);
                  l = (LOGGER_LOG)0x0;
                }
                else {
                  iVar1 = provisionDevices((IOTHUB_ACCOUNT_INFO *)l,IOTHUB_ACCOUNT_AUTH_CONNSTRING,
                                           ((IOTHUB_ACCOUNT_INFO *)l)->sasDevices,
                                           ((IOTHUB_ACCOUNT_INFO *)l)->number_of_sas_devices);
                  if (iVar1 != 0) {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                                ,"IoTHubAccount_Init_With_Config",0x30f,1,
                                "Failed to create the SAS device(s)\r\n");
                    }
                    IoTHubAccount_deinit((IOTHUB_ACCOUNT_INFO_HANDLE)l);
                    l = (LOGGER_LOG)0x0;
                  }
                }
              }
            }
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                        ,"IoTHubAccount_Init_With_Config",0x2ec,1,
                        "retrieveConnStringInfo failed.\r\n");
            }
            free(l);
            l = (LOGGER_LOG)0x0;
          }
        }
      }
    }
  }
  return (IOTHUB_ACCOUNT_INFO_HANDLE)l;
}

Assistant:

IOTHUB_ACCOUNT_INFO_HANDLE IoTHubAccount_Init_With_Config(IOTHUB_ACCOUNT_CONFIG* config, bool testingModules)
{
    (void)testingModules;
    IOTHUB_ACCOUNT_INFO* iothub_account_info;

    if (config == NULL)
    {
        LogError("[IoTHubAccount] invalid configuration (NULL)");
        iothub_account_info = NULL;
    }
    else
    {
        iothub_account_info = malloc(sizeof(IOTHUB_ACCOUNT_INFO));

        if (iothub_account_info == NULL)
        {
            LogError("[IoTHubAccount] Failed allocating IOTHUB_ACCOUNT_INFO.");
        }
        else
        {
            char* base64_cert;
            char* base64_key;
            char* tempThumb;
            memset(iothub_account_info, 0, sizeof(IOTHUB_ACCOUNT_INFO));

            if ((iothub_account_info->sasDevices = (IOTHUB_PROVISIONED_DEVICE**)malloc(sizeof(IOTHUB_PROVISIONED_DEVICE*) * config->number_of_sas_devices)) == NULL)
            {
                LogError("[IoTHubAccount] Failed allocating array for SAS devices");
                free(iothub_account_info);
                iothub_account_info = NULL;
            }
            else
            {
                iothub_account_info->number_of_sas_devices = config->number_of_sas_devices;
                memset(iothub_account_info->sasDevices, 0, sizeof(IOTHUB_PROVISIONED_DEVICE*) * iothub_account_info->number_of_sas_devices);

#ifdef MBED_BUILD_TIMESTAMP
                iothub_account_info->connString = getMbedParameter("IOTHUB_CONNECTION_STRING");
                iothub_account_info->eventhubConnString = getMbedParameter("IOTHUB_EVENTHUB_CONNECTION_STRING");
                tempCert = getMbedParameter("IOTHUB_E2E_X509_CERT");
                tempKey = getMbedParameter("IOTHUB_E2E_X509_PRIVATE_KEY");
                tempThump = getMbedParameter("IOTHUB_E2E_X509_THUMBPRINT");
#else
                iothub_account_info->connString = getenv("IOTHUB_CONNECTION_STRING");
                iothub_account_info->eventhubConnString = getenv("IOTHUB_EVENTHUB_CONNECTION_STRING");
                base64_cert = getenv("IOTHUB_E2E_X509_CERT_BASE64");
                base64_key = getenv("IOTHUB_E2E_X509_PRIVATE_KEY_BASE64");
                tempThumb = getenv("IOTHUB_E2E_X509_THUMBPRINT");
#endif

                if (iothub_account_info->connString == NULL)
                {
                    LogError("Failure retrieving IoT Hub connection string from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if (iothub_account_info->eventhubConnString == NULL)
                {
                    LogError("Failure retrieving Event Hub connection string from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                /*else if (base64_cert == NULL)
                {
                    LogError("Failure retrieving x509 certificate from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if (base64_key == NULL)
                {
                    LogError("Failure retrieving x509 private key from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if (tempThumb == NULL)
                {
                    LogError("Failure retrieving x509 certificate thumbprint from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if ((iothub_account_info->x509Certificate = convert_base64_to_string(base64_cert)) == NULL)
                {
                    LogError("Failure allocating x509 certificate from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if ((iothub_account_info->x509PrivateKey = convert_base64_to_string(base64_key)) == NULL)
                {
                    LogError("Failure allocating x509 key from the environment.\r\n");
                    free(iothub_account_info->x509Certificate);
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if (mallocAndStrcpy_s(&iothub_account_info->x509Thumbprint, tempThumb) != 0)
                {
                    LogError("Failure allocating x509 thumb print from the environment.\r\n");
                    free(iothub_account_info->x509Certificate);
                    free(iothub_account_info->x509PrivateKey);
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }*/
                else
                {
                    if (retrieveConnStringInfo(iothub_account_info) != 0)
                    {
                        LogError("retrieveConnStringInfo failed.\r\n");
                        free(iothub_account_info);
                        iothub_account_info = NULL;
                    }
                    else
                    {
                        iothub_account_info->iothub_service_client_auth_handle = IoTHubServiceClientAuth_CreateFromConnectionString(iothub_account_info->connString);
                        if (iothub_account_info->iothub_service_client_auth_handle == NULL)
                        {
                            LogError("IoTHubServiceClientAuth_CreateFromConnectionString failed\r\n");
                            free(iothub_account_info);
                            iothub_account_info = NULL;
                        }
                        else
                        {
                            iothub_account_info->iothub_messaging_handle = IoTHubMessaging_LL_Create(iothub_account_info->iothub_service_client_auth_handle);
                            if (iothub_account_info->iothub_messaging_handle == NULL)
                            {
                                LogError("IoTHubMessaging_LL_Create failed\r\n");
                                IoTHubAccount_deinit(iothub_account_info);
                                iothub_account_info = NULL;
                            }
                            else
                            {
                                iothub_account_info->iothub_registrymanager_handle = IoTHubRegistryManager_Create(iothub_account_info->iothub_service_client_auth_handle);
                                if (iothub_account_info->iothub_registrymanager_handle == NULL)
                                {
                                    LogError("IoTHubRegistryManager_Create failed\r\n");
                                    IoTHubAccount_deinit(iothub_account_info);
                                    iothub_account_info = NULL;
                                }
                                else
                                {
                                    if (provisionDevices(iothub_account_info, IOTHUB_ACCOUNT_AUTH_CONNSTRING, iothub_account_info->sasDevices, iothub_account_info->number_of_sas_devices) != 0)
                                    {
                                        LogError("Failed to create the SAS device(s)\r\n");
                                        IoTHubAccount_deinit(iothub_account_info);
                                        iothub_account_info = NULL;
                                    }
                                    //else if (provisionDevice(iothub_account_info, IOTHUB_ACCOUNT_AUTH_X509, &iothub_account_info->x509Device) != 0)
                                    //{
                                    //    LogError("Failed to create the X509 device\r\n");
                                    //    IoTHubAccount_deinit(iothub_account_info);
                                    //    iothub_account_info = NULL;
                                    //}
                                    //else if (testingModules && provisionModule(iothub_account_info, iothub_account_info->sasDevices[0]))
                                    //{
                                    //    LogError("Failed to create the module\r\n");
                                    //    IoTHubAccount_deinit(iothub_account_info);
                                    //    iothub_account_info = NULL;
                                    //}
                                }
                            }
                        }
                    }
                }
            }
        }
    }

    return (IOTHUB_ACCOUNT_INFO_HANDLE)iothub_account_info;
}